

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O2

void __thiscall addrman_tests::addrman_simple::test_method(addrman_simple *this)

{
  long lVar1;
  CService ipIn;
  CService ipIn_00;
  CService ipIn_01;
  __single_object _Var2;
  undefined **__p;
  bool bVar3;
  readonly_property<bool> rVar4;
  int32_t iVar5;
  uint uVar6;
  size_t sVar7;
  iterator in_R8;
  iterator pvVar8;
  iterator in_R9;
  CAddress *pCVar9;
  iterator pvVar10;
  CService *pCVar11;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string file;
  const_string file_00;
  const_string file_01;
  initializer_list<CAddress> __l;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  initializer_list<CAddress> __l_00;
  const_string file_05;
  const_string file_06;
  initializer_list<CAddress> __l_01;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  undefined4 uVar12;
  undefined4 uVar13;
  char *pcVar14;
  assertion_result *ar;
  char *pcVar15;
  undefined8 in_stack_fffffffffffffb60;
  NodeContext *node_ctx;
  undefined8 in_stack_fffffffffffffb68;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  allocator_type local_3e1;
  vector<CAddress,_std::allocator<CAddress>_> local_3e0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  vector<CAddress,_std::allocator<CAddress>_> vAddr;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  __single_object addrman;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_228;
  CService local_218;
  CService addr2;
  CService local_1c8;
  CService addr1_dup;
  __node_base_ptr p_Stack_170;
  CService local_168;
  CService addr1;
  CAddress addr_ret1;
  undefined **local_d8 [2];
  undefined1 *local_c8;
  assertion_result *local_c0;
  uint16_t local_b8;
  duration local_b0;
  ServiceFlags SStack_a8;
  CAddress addr_null;
  CNetAddr source;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  node_ctx = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node;
  iVar5 = GetCheckRatio(node_ctx);
  local_d8[0] = (undefined **)CONCAT44(local_d8[0]._4_4_,iVar5);
  std::make_unique<AddrMan,NetGroupManager&,bool_const&,int>
            ((NetGroupManager *)&addrman,(bool *)&EMPTY_NETGROUPMAN,(int *)&DETERMINISTIC);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8,"252.2.2.2",(allocator<char> *)&addr_null);
  ResolveIP(&source,(string *)local_d8);
  std::__cxx11::string::~string((string *)local_d8);
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x48;
  file.m_begin = (iterator)&local_250;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_260,msg);
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_01139f30;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (assertion_result *)0xc694e1;
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_268 = "";
  addr_null.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x0);
  pCVar9 = &addr_null;
  addr_ret1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)(uint)addr_ret1.super_CService.super_CNetAddr.m_addr._union._4_4_ << 0x20);
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_d8,&local_270,0x48,1,2,pCVar9,0xb4ecd9,&addr_ret1,"0U");
  addr_ret1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&addr_ret1.nServices;
  addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ = 1;
  addr_ret1.super_CService.super_CNetAddr.m_addr._size = 0;
  addr_ret1.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  addr_ret1.super_CService.super_CNetAddr.m_net = NET_UNROUTABLE;
  addr_ret1.super_CService.super_CNetAddr.m_scope_id = 0;
  addr_ret1.super_CService.port = 0;
  addr_ret1.super_CService._34_6_ = 0x3f80;
  addr_ret1.nTime.__d.__r = (duration)0;
  addr_ret1.nServices = NODE_NONE;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)local_d8,
                  (AddrMan *)
                  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&addr_ret1);
  addr_null.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       CONCAT71(local_d8[1]._1_7_,local_d8[1]._0_1_);
  addr_null.super_CService.super_CNetAddr.m_addr._size = local_c8._0_4_;
  local_c8 = (undefined1 *)((ulong)local_c8 & 0xffffffff00000000);
  addr_null.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)local_d8[0];
  addr_null.super_CService.super_CNetAddr._24_8_ = local_c0;
  addr_null.super_CService.port = local_b8;
  addr_null.nTime.__d.__r = (duration)(duration)local_b0.__r;
  addr_null.nServices = SStack_a8;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_d8);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&addr_ret1);
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)pCVar9;
  msg_00.m_begin = pvVar8;
  file_00.m_end = (iterator)0x4a;
  file_00.m_begin = (iterator)&local_280;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_290,
             msg_00);
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_01139f30;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (assertion_result *)0xc694e1;
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_298 = "";
  CService::ToStringAddrPort_abi_cxx11_((string *)&addr_ret1,&addr_null.super_CService);
  pcVar15 = "\"[::]:0\"";
  pcVar14 = "[::]:0";
  uVar12 = 0xb4ece9;
  uVar13 = 0;
  pvVar8 = (iterator)0x2;
  pCVar9 = &addr_ret1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
            (local_d8,&local_2a0,0x4a,1);
  std::__cxx11::string::~string((string *)&addr_ret1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8,"250.1.1.1",(allocator<char> *)&addr_ret1);
  ResolveService(&addr1,(string *)local_d8,0x208d);
  std::__cxx11::string::~string((string *)local_d8);
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)pCVar9;
  msg_01.m_begin = pvVar8;
  file_01.m_end = (iterator)0x4e;
  file_01.m_begin = (iterator)&local_2b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2c0,
             msg_01);
  _Var2 = addrman;
  CService::CService(&local_168,&addr1);
  ipIn.super_CNetAddr.m_addr._union._4_4_ = uVar13;
  ipIn.super_CNetAddr.m_addr._union._0_4_ = uVar12;
  ipIn.super_CNetAddr.m_addr._union._8_8_ = pcVar14;
  ipIn.super_CNetAddr.m_addr._16_8_ = pcVar15;
  ipIn.super_CNetAddr.m_net = (int)in_stack_fffffffffffffb60;
  ipIn.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffb60 >> 0x20);
  ipIn._32_8_ = in_stack_fffffffffffffb68;
  CAddress::CAddress((CAddress *)local_d8,ipIn,(ServiceFlags)&local_168);
  __l._M_len = 1;
  __l._M_array = (iterator)local_d8;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&addr2,__l,(allocator_type *)&vAddr);
  bVar3 = AddrMan::Add((AddrMan *)
                       _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&addr2,&source,(seconds)0x0);
  addr1_dup.super_CNetAddr.m_addr._union.direct[0] = bVar3;
  addr1_dup.super_CNetAddr.m_addr._union._8_8_ = 0;
  addr1_dup.super_CNetAddr.m_addr._size = 0;
  addr1_dup.super_CNetAddr.m_addr._20_4_ = 0;
  addr_ret1.super_CService.super_CNetAddr._24_8_ = local_238;
  local_238._0_8_ = "addrman->Add({CAddress(addr1, NODE_NONE)}, source)";
  local_238._8_8_ = "";
  addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr_ret1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr_ret1.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2c8 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&addr1_dup,(lazy_ostream *)&addr_ret1,1,0,WARN,(check_type)pcVar14,
             (size_t)&local_2d0,0x4e);
  boost::detail::shared_count::~shared_count((shared_count *)&addr1_dup.super_CNetAddr.m_addr._size)
  ;
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&addr2);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_d8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_168);
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar10;
  msg_02.m_begin = pvVar8;
  file_02.m_end = (iterator)0x4f;
  file_02.m_begin = (iterator)&local_2e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2f0,
             msg_02);
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_01139f30;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (assertion_result *)0xc694e1;
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2f8 = "";
  addr_ret1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x0);
  pCVar9 = &addr_ret1;
  addr1_dup.super_CNetAddr.m_addr._union._0_4_ = 1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_d8,&local_300,0x4f,1,2,pCVar9,0xb4ecd9,&addr1_dup,"1U");
  addr1_dup.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)&p_Stack_170;
  addr1_dup.super_CNetAddr.m_addr._union._8_8_ = 1;
  addr1_dup.super_CNetAddr.m_addr._size = 0;
  addr1_dup.super_CNetAddr.m_addr._20_4_ = 0;
  addr1_dup.super_CNetAddr.m_net = NET_UNROUTABLE;
  addr1_dup.super_CNetAddr.m_scope_id = 0;
  addr1_dup.port = 0;
  addr1_dup._34_6_ = 0x3f80;
  p_Stack_170 = (__node_base_ptr)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)local_d8,
                  (AddrMan *)
                  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&addr1_dup);
  addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       CONCAT71(local_d8[1]._1_7_,local_d8[1]._0_1_);
  uVar12 = local_c8._0_4_;
  local_c8 = (undefined1 *)((ulong)local_c8 & 0xffffffff00000000);
  addr_ret1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)local_d8[0];
  addr_ret1.super_CService.super_CNetAddr.m_addr._size = uVar12;
  addr_ret1.super_CService.super_CNetAddr._24_8_ = local_c0;
  addr_ret1.super_CService.port = local_b8;
  addr_ret1.nTime.__d.__r = (duration)(duration)local_b0.__r;
  addr_ret1.nServices = SStack_a8;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_d8);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&addr1_dup);
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)pCVar9;
  msg_03.m_begin = pvVar8;
  file_03.m_end = (iterator)0x51;
  file_03.m_begin = (iterator)&local_310;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_320,
             msg_03);
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_01139f30;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (assertion_result *)0xc694e1;
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_328 = "";
  CService::ToStringAddrPort_abi_cxx11_((string *)&addr1_dup,&addr_ret1.super_CService);
  pcVar15 = "\"250.1.1.1:8333\"";
  pcVar14 = "250.1.1.1:8333";
  uVar12 = 0xb4ed4a;
  uVar13 = 0;
  pvVar8 = (iterator)0x2;
  pCVar11 = &addr1_dup;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[15]>
            (local_d8,&local_330,0x51,1);
  std::__cxx11::string::~string((string *)&addr1_dup);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8,"250.1.1.1",(allocator<char> *)&addr2);
  ResolveService(&addr1_dup,(string *)local_d8,0x208d);
  std::__cxx11::string::~string((string *)local_d8);
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)pCVar11;
  msg_04.m_begin = pvVar8;
  file_04.m_end = (iterator)0x56;
  file_04.m_begin = (iterator)&local_340;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_350,
             msg_04);
  _Var2 = addrman;
  CService::CService(&local_1c8,&addr1_dup);
  ipIn_00.super_CNetAddr.m_addr._union._4_4_ = uVar13;
  ipIn_00.super_CNetAddr.m_addr._union._0_4_ = uVar12;
  ipIn_00.super_CNetAddr.m_addr._union._8_8_ = pcVar14;
  ipIn_00.super_CNetAddr.m_addr._16_8_ = pcVar15;
  ipIn_00.super_CNetAddr._24_8_ = node_ctx;
  ipIn_00._32_8_ = in_stack_fffffffffffffb68;
  CAddress::CAddress((CAddress *)local_d8,ipIn_00,(ServiceFlags)&local_1c8);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_d8;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            (&vAddr,__l_00,(allocator_type *)&local_3f8);
  bVar3 = AddrMan::Add((AddrMan *)
                       _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&vAddr,&source,
                       (seconds)0x0);
  ar = (assertion_result *)local_238;
  local_238[0] = (class_property<bool>)(class_property<bool>)!bVar3;
  local_238._8_8_ = (element_type *)0x0;
  aStack_228._M_allocated_capacity = 0;
  addr2.super_CNetAddr._24_8_ = &local_3e0;
  local_3e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xb4ed87;
  local_3e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb4edbe;
  addr2.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr2.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_370 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (ar,(lazy_ostream *)&addr2,1,0,WARN,(check_type)pcVar14,(size_t)&local_378,0x56);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_228._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_d8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1c8);
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar10;
  msg_05.m_begin = pvVar8;
  file_05.m_end = (iterator)0x57;
  file_05.m_begin = (iterator)&local_388;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_398,
             msg_05);
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_01139f30;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (assertion_result *)0xc694e1;
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3a0 = "";
  addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x0);
  pCVar11 = &addr2;
  local_238._0_4_ = 1;
  pcVar14 = "1U";
  uVar12 = 0xb4ecd9;
  uVar13 = 0;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_d8,&local_3a8,0x57,1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8,"250.1.1.2",(allocator<char> *)local_238);
  ResolveService(&addr2,(string *)local_d8,0x208d);
  std::__cxx11::string::~string((string *)local_d8);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = (iterator)pCVar11;
  msg_06.m_begin = pvVar8;
  file_06.m_end = (iterator)0x61;
  file_06.m_begin = (iterator)&local_3b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3c8,
             msg_06);
  _Var2 = addrman;
  CService::CService(&local_218,&addr2);
  ipIn_01.super_CNetAddr.m_addr._union._4_4_ = uVar13;
  ipIn_01.super_CNetAddr.m_addr._union._0_4_ = uVar12;
  ipIn_01.super_CNetAddr.m_addr._union._8_8_ = ar;
  ipIn_01.super_CNetAddr.m_addr._16_8_ = pcVar14;
  ipIn_01.super_CNetAddr._24_8_ = node_ctx;
  ipIn_01._32_8_ = in_stack_fffffffffffffb68;
  CAddress::CAddress((CAddress *)local_d8,ipIn_01,(ServiceFlags)&local_218);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_d8;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector(&local_3e0,__l_01,&local_3e1);
  bVar3 = AddrMan::Add((AddrMan *)
                       _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&local_3e0,&source,
                       (seconds)0x0);
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl
                               .super__Vector_impl_data._M_start._1_7_,bVar3);
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3f8 = "addrman->Add({CAddress(addr2, NODE_NONE)}, source)";
  local_3f0 = "";
  local_238._8_8_ = local_238._8_8_ & 0xffffffffffffff00;
  local_238._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_228._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_400 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  aStack_228._8_8_ = (allocator_type *)&local_3f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&vAddr,(lazy_ostream *)local_238,1,0,WARN,(check_type)ar,
             (size_t)&local_408,0x61);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_3e0);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_d8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_218);
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar10;
  msg_07.m_begin = pvVar8;
  file_07.m_end = (iterator)0x62;
  file_07.m_begin = (iterator)&local_418;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_428,
             msg_07);
  sVar7 = AddrMan::Size((AddrMan *)
                        addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(optional<Network>)0x0,
                        (optional<bool>)0x0);
  local_238[0] = (class_property<bool>)(class_property<bool>)(sVar7 != 0);
  local_238._8_8_ = (element_type *)0x0;
  aStack_228._M_allocated_capacity = 0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_12742c;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb4ee10;
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_0113a070;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_430 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_c0 = (assertion_result *)&vAddr;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_238,(lazy_ostream *)local_d8,1,0,WARN,(check_type)ar,
             (size_t)&local_438,0x62);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_228._M_allocated_capacity);
  uVar6 = GetCheckRatio(node_ctx);
  local_238._0_4_ = uVar6;
  std::make_unique<AddrMan,NetGroupManager&,bool_const&,int>
            ((NetGroupManager *)local_d8,(bool *)&EMPTY_NETGROUPMAN,(int *)&DETERMINISTIC);
  __p = local_d8[0];
  local_d8[0] = (undefined **)0x0;
  std::__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>::reset
            ((__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_> *)&addrman,(pointer)__p);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)local_d8);
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_238,"250.1.1.3",(allocator<char> *)&local_3f8);
  ResolveService((CService *)local_d8,(string *)local_238,0x208d);
  local_3e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<CAddress,std::allocator<CAddress>>::emplace_back<CService,ServiceFlags>
            ((vector<CAddress,std::allocator<CAddress>> *)&vAddr,(CService *)local_d8,
             (ServiceFlags *)&local_3e0);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_d8);
  std::__cxx11::string::~string((string *)local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_238,"250.1.1.4",(allocator<char> *)&local_3f8);
  ResolveService((CService *)local_d8,(string *)local_238,0x208d);
  local_3e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<CAddress,std::allocator<CAddress>>::emplace_back<CService,ServiceFlags>
            ((vector<CAddress,std::allocator<CAddress>> *)&vAddr,(CService *)local_d8,
             (ServiceFlags *)&local_3e0);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_d8);
  std::__cxx11::string::~string((string *)local_238);
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar10;
  msg_08.m_begin = pvVar8;
  file_08.m_end = (iterator)0x69;
  file_08.m_begin = (iterator)&local_448;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_458,
             msg_08);
  rVar4.super_class_property<bool>.value =
       (class_property<bool>)
       AddrMan::Add((AddrMan *)
                    addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&vAddr,&source,(seconds)0x0
                   );
  local_238._8_8_ = (element_type *)0x0;
  aStack_228._M_allocated_capacity = 0;
  local_3e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xb4ee25;
  local_3e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb4ee40;
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_0113a070;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_460 = "";
  pvVar8 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_c0 = (assertion_result *)&local_3e0;
  local_238[0] = rVar4.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_238,(lazy_ostream *)local_d8,1,0,WARN,(check_type)ar,
             (size_t)&local_468,0x69);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_228._M_allocated_capacity);
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar10;
  msg_09.m_begin = pvVar8;
  file_09.m_end = (iterator)0x6a;
  file_09.m_begin = (iterator)&local_478;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_488,
             msg_09);
  sVar7 = AddrMan::Size((AddrMan *)
                        addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(optional<Network>)0x0,
                        (optional<bool>)0x0);
  local_238[0] = (class_property<bool>)(class_property<bool>)(sVar7 != 0);
  local_238._8_8_ = (element_type *)0x0;
  aStack_228._M_allocated_capacity = 0;
  local_3e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xb4edfc;
  local_3e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb4ee10;
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_0113a070;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (assertion_result *)&local_3e0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_238,(lazy_ostream *)local_d8,1,0,WARN,(check_type)ar,
             (size_t)&stack0xfffffffffffffb68,0x6a);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_228._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr2);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1_dup);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr_ret1);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr_null);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&source.m_addr);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_simple)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));

    CNetAddr source = ResolveIP("252.2.2.2");

    // Test: Does Addrman respond correctly when empty.
    BOOST_CHECK_EQUAL(addrman->Size(), 0U);
    auto addr_null = addrman->Select().first;
    BOOST_CHECK_EQUAL(addr_null.ToStringAddrPort(), "[::]:0");

    // Test: Does Addrman::Add work as expected.
    CService addr1 = ResolveService("250.1.1.1", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr1, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);
    auto addr_ret1 = addrman->Select().first;
    BOOST_CHECK_EQUAL(addr_ret1.ToStringAddrPort(), "250.1.1.1:8333");

    // Test: Does IP address deduplication work correctly.
    //  Expected dup IP should not be added.
    CService addr1_dup = ResolveService("250.1.1.1", 8333);
    BOOST_CHECK(!addrman->Add({CAddress(addr1_dup, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);


    // Test: New table has one addr and we add a diff addr we should
    //  have at least one addr.
    // Note that addrman's size cannot be tested reliably after insertion, as
    // hash collisions may occur. But we can always be sure of at least one
    // success.

    CService addr2 = ResolveService("250.1.1.2", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr2, NODE_NONE)}, source));
    BOOST_CHECK(addrman->Size() >= 1);

    // Test: reset addrman and test AddrMan::Add multiple addresses works as expected
    addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));
    std::vector<CAddress> vAddr;
    vAddr.emplace_back(ResolveService("250.1.1.3", 8333), NODE_NONE);
    vAddr.emplace_back(ResolveService("250.1.1.4", 8333), NODE_NONE);
    BOOST_CHECK(addrman->Add(vAddr, source));
    BOOST_CHECK(addrman->Size() >= 1);
}